

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

sqlite3_value * valueNew(sqlite3 *db,ValueNewStat4Ctx *p)

{
  int iVar1;
  Index *pIdx;
  sqlite3_value *psVar2;
  UnpackedRecord *p_00;
  KeyInfo *pKVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  if (p == (ValueNewStat4Ctx *)0x0) {
    psVar2 = (sqlite3_value *)sqlite3DbMallocZero(db,0x38);
    if (psVar2 != (sqlite3_value *)0x0) {
      psVar2->flags = 1;
      psVar2->db = db;
      return psVar2;
    }
  }
  else {
    p_00 = *p->ppRec;
    if (p_00 != (UnpackedRecord *)0x0) {
LAB_0016d9ec:
      iVar1 = p->iVal;
      p_00->nField = (short)iVar1 + 1;
      return p_00->aMem + iVar1;
    }
    pIdx = p->pIdx;
    uVar5 = (ulong)pIdx->nColumn;
    lVar6 = uVar5 * 0x38;
    p_00 = (UnpackedRecord *)sqlite3DbMallocZero(db,lVar6 + 0x18);
    if (p_00 != (UnpackedRecord *)0x0) {
      pKVar3 = sqlite3KeyInfoOfIndex(p->pParse,pIdx);
      p_00->pKeyInfo = pKVar3;
      if (pKVar3 != (KeyInfo *)0x0) {
        p_00->aMem = (Mem *)(p_00 + 1);
        if (uVar5 != 0) {
          lVar4 = 0;
          do {
            *(undefined2 *)((long)&p_00[1].aMem + lVar4) = 1;
            *(sqlite3 **)((long)&p_00[2].nField + lVar4) = db;
            lVar4 = lVar4 + 0x38;
          } while (lVar6 - lVar4 != 0);
        }
        *p->ppRec = p_00;
        goto LAB_0016d9ec;
      }
      sqlite3DbFreeNN(db,p_00);
    }
  }
  return (sqlite3_value *)0x0;
}

Assistant:

static sqlite3_value *valueNew(sqlite3 *db, struct ValueNewStat4Ctx *p){
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( p ){
    UnpackedRecord *pRec = p->ppRec[0];

    if( pRec==0 ){
      Index *pIdx = p->pIdx;      /* Index being probed */
      int nByte;                  /* Bytes of space to allocate */
      int i;                      /* Counter variable */
      int nCol = pIdx->nColumn;   /* Number of index columns including rowid */
  
      nByte = sizeof(Mem) * nCol + ROUND8(sizeof(UnpackedRecord));
      pRec = (UnpackedRecord*)sqlite3DbMallocZero(db, nByte);
      if( pRec ){
        pRec->pKeyInfo = sqlite3KeyInfoOfIndex(p->pParse, pIdx);
        if( pRec->pKeyInfo ){
          assert( pRec->pKeyInfo->nAllField==nCol );
          assert( pRec->pKeyInfo->enc==ENC(db) );
          pRec->aMem = (Mem *)((u8*)pRec + ROUND8(sizeof(UnpackedRecord)));
          for(i=0; i<nCol; i++){
            pRec->aMem[i].flags = MEM_Null;
            pRec->aMem[i].db = db;
          }
        }else{
          sqlite3DbFreeNN(db, pRec);
          pRec = 0;
        }
      }
      if( pRec==0 ) return 0;
      p->ppRec[0] = pRec;
    }
  
    pRec->nField = p->iVal+1;
    return &pRec->aMem[p->iVal];
  }
#else
  UNUSED_PARAMETER(p);
#endif /* defined(SQLITE_ENABLE_STAT3_OR_STAT4) */
  return sqlite3ValueNew(db);
}